

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_read.c
# Opt level: O0

int getlx(char **iline,FILE *fp)

{
  FILE *pFVar1;
  char *pcVar2;
  int *piVar3;
  size_t sVar4;
  char *eol_1;
  size_t used;
  size_t remaining;
  size_t capacity;
  char *eol;
  char *buf;
  char *newline;
  char *line;
  FILE *fp_local;
  char **iline_local;
  
  eol = *iline;
  remaining = 8;
  used = 8;
  *eol = '\0';
  newline = eol;
  do {
    pcVar2 = fgets(eol,(int)used,(FILE *)fp);
    if (pcVar2 == (char *)0x0) {
LAB_00105af9:
      piVar3 = __errno_location();
      pFVar1 = _stderr;
      if (*piVar3 == 0) {
        if (*newline != '\0') {
          pcVar2 = strchr(eol,10);
          if (pcVar2 != (char *)0x0) {
            *pcVar2 = '\0';
          }
          sVar4 = strlen(newline);
          return (int)sVar4;
        }
      }
      else {
        piVar3 = __errno_location();
        pcVar2 = strerror(*piVar3);
        fprintf(pFVar1,"getl - fgets: %s\n",pcVar2);
      }
      return -1;
    }
    pcVar2 = strchr(eol,10);
    if (pcVar2 != (char *)0x0) {
      *pcVar2 = '\0';
      goto LAB_00105af9;
    }
    pcVar2 = eol + (used - (long)newline);
    newline = (char *)realloc(newline,remaining << 1);
    pFVar1 = _stderr;
    if (newline == (char *)0x0) {
      piVar3 = __errno_location();
      pcVar2 = strerror(*piVar3);
      fprintf(pFVar1,"getl - realloc: %s\n",pcVar2);
      return -1;
    }
    eol = newline + (long)(pcVar2 + -1);
    remaining = remaining * 2;
    used = remaining - (long)pcVar2;
  } while( true );
}

Assistant:

int getlx(char **iline,FILE *fp)
	{
		char *line = *iline;
		char *newline = NULL;
		char *buf = NULL;
		char *eol = NULL;
		size_t capacity = sizeof(line); /* reasonable starting point for line length */
		size_t remaining = capacity;
		size_t used = 0;

		buf = line; /* point buf -> line */
		line[0] = '\0';

		/* read file  into buf */
		while (fgets(buf, remaining, fp)) {
			eol = strchr(buf, '\n'); /* locate first occurrence of '\n' */
			if (eol) { /* found a newline in the string */
				*eol = '\0'; /* replace the newline with the null character */
				break;
			} else {
				/* buffer was too small - enlarge it */
				used = buf + remaining - line;

				newline = realloc(line, capacity * 2);
				if (!newline) {
					fprintf(stderr, "getl - realloc: %s\n", strerror(errno));
					return -1;
				} else {
					line = newline;
				}

				buf = line + used - 1;
				capacity *= 2;
				remaining = capacity - used;
			}
		}

		if (errno) {
			fprintf(stderr, "getl - fgets: %s\n", strerror(errno));
		} else if (line[0]) {
			char *eol = strchr(buf, '\n');
			if (eol)
				*eol = '\0';
			/*buf = line;*/
			return strlen(line);
		}
		return -1;
	}